

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O2

bool __thiscall lan::db::declare(db *this,string *target,string *name,db_bit_type type)

{
  bool bVar1;
  db_bits *context;
  invalid_argument *this_00;
  string *name_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_90,(string *)target);
  context = find_rec(this,&local_90,Container,this->first);
  this->data = context;
  if (context != (db_bits *)0x0) {
    if (context->lin == (db_bit *)0x0) {
      name_00 = &local_70;
      std::__cxx11::string::string((string *)name_00,(string *)name);
      bVar1 = init<int>(this,context,name_00,0,type);
    }
    else {
      name_00 = &local_50;
      std::__cxx11::string::string((string *)name_00,(string *)name);
      bVar1 = append<int>(this,context,name_00,0,type);
    }
    std::__cxx11::string::~string((string *)name_00);
    std::__cxx11::string::~string((string *)&local_90);
    return bVar1;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_d0,target,"{Container}");
  error_string(&local_b0,(db *)target,_bit_name_error,&local_d0);
  std::invalid_argument::invalid_argument(this_00,(string *)&local_b0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool db::declare(std::string const target, std::string const name, db_bit_type const type){
            return ((data = find_rec(target, lan::Container, first)))
            ? (data->lin) ? append(data, name, 0, type) : init(data, name, 0, type): throw lan::errors::bit_name_error(error_string(errors::_private::_bit_name_error, target+("{Container}")));
        }